

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::passHessian(Highs *this,HighsHessian *hessian_)

{
  HighsHessian *hessian;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *__x;
  HighsLogOptions *log_options_;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  HessianFormat HVar6;
  bool bVar7;
  HighsStatus HVar8;
  HighsInt HVar9;
  HighsStatus HVar10;
  long lVar11;
  string local_120;
  double local_100;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  HVar6 = hessian_->format_;
  (this->model_).hessian_.dim_ = hessian_->dim_;
  (this->model_).hessian_.format_ = HVar6;
  piVar2 = (this->model_).hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (hessian_->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->model_).hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (hessian_->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->model_).hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar4;
  (this->model_).hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (hessian_->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (hessian_->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (hessian_->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (hessian_->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->model_).hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (hessian_->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->model_).hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (hessian_->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->model_).hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar4;
  (this->model_).hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (hessian_->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (hessian_->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (hessian_->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (hessian_->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  hessian = &(this->model_).hessian_;
  pdVar3 = (this->model_).hessian_.value_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (hessian_->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->model_).hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (hessian_->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->model_).hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar5;
  (this->model_).hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (hessian_->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (hessian_->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (hessian_->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (hessian_->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  pfVar1 = &local_98.user_callback;
  __x = &(this->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar1,__x);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar8 = assessHessian(hessian,&this->options_);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"assessHessian","");
  HVar8 = interpretCallStatus(&local_98,HVar8,kOk,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  HVar10 = kError;
  if (HVar8 != kError) {
    log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
    if (hessian->dim_ != 0) {
      HVar9 = HighsHessian::numNz(hessian);
      if (HVar9 == 0) {
        highsLogUser(log_options_,kInfo,"Hessian has dimension %d but no nonzeros, so is ignored\n",
                     (ulong)(uint)hessian->dim_);
        HighsHessian::clear(hessian);
      }
      if (hessian->dim_ != 0) {
        completeHessian((this->model_).lp_.num_col_,hessian);
      }
    }
    HVar9 = (this->model_).lp_.user_cost_scale_;
    if (HVar9 != 0) {
      bVar7 = HighsHessian::scaleOk
                        (hessian,HVar9,(this->options_).super_HighsOptionsStruct.small_matrix_value,
                         (this->options_).super_HighsOptionsStruct.large_matrix_value);
      if (!bVar7) {
        highsLogUser(log_options_,kError,
                     "User cost scaling yields zeroed or excessive Hessian values\n");
        return kError;
      }
      local_100 = ldexp(1.0,(this->model_).lp_.user_cost_scale_);
      HVar9 = HighsHessian::numNz(hessian);
      if (0 < HVar9) {
        lVar11 = 0;
        do {
          pdVar3 = (this->model_).hessian_.value_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[lVar11] = pdVar3[lVar11] * local_100;
          lVar11 = lVar11 + 1;
          HVar9 = HighsHessian::numNz(hessian);
        } while (lVar11 < HVar9);
      }
    }
    local_f8.log_stream = log_options_->log_stream;
    local_f8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
    local_f8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
    local_f8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
    local_f8.user_log_callback =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
    local_f8.user_log_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
    pfVar1 = &local_f8.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,__x);
    local_f8.user_callback_active =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_f8.user_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    HVar10 = clearSolver(this);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"clearSolver","");
    HVar8 = interpretCallStatus(&local_f8,HVar10,HVar8,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_f8.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    HVar10 = returnFromHighs(this,HVar8);
  }
  return HVar10;
}

Assistant:

HighsStatus Highs::passHessian(HighsHessian hessian_) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  HighsHessian& hessian = model_.hessian_;
  hessian = std::move(hessian_);
  // Check validity of any Hessian, normalising its entries
  return_status = interpretCallStatus(options_.log_options,
                                      assessHessian(hessian, options_),
                                      return_status, "assessHessian");
  if (return_status == HighsStatus::kError) return return_status;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed
  if (hessian.dim_) completeHessian(this->model_.lp_.num_col_, hessian);

  if (this->model_.lp_.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!hessian.scaleOk(this->model_.lp_.user_cost_scale_,
                         this->options_.small_matrix_value,
                         this->options_.large_matrix_value)) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "User cost scaling yields zeroed or excessive Hessian values\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, this->model_.lp_.user_cost_scale_);
    for (HighsInt iEl = 0; iEl < hessian.numNz(); iEl++)
      hessian.value_[iEl] *= cost_scale_value;
  }
  return_status = interpretCallStatus(options_.log_options, clearSolver(),
                                      return_status, "clearSolver");
  return returnFromHighs(return_status);
}